

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadBoundsFirst_Test::TestBody(NLReaderTest_ReadBoundsFirst_Test *this)

{
  MockNLHandler *this_00;
  MockSpec<void_(int,_double,_double)> *__lhs;
  NLHeader *this_01;
  NLHeader header;
  InSequence dummy;
  NiceMock<MockNLHandler> handler;
  AnythingMatcher *in_stack_fffffffffffffa68;
  string *s;
  MockNLHandler *in_stack_fffffffffffffa70;
  Matcher<int> *in_stack_fffffffffffffa78;
  NiceMock<MockNLHandler> *in_stack_fffffffffffffa80;
  BasicCStringRef<char> local_578;
  InSequence *in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa9c;
  Matcher<int> *in_stack_fffffffffffffaa0;
  double in_stack_fffffffffffffaa8;
  Matcher<double> *in_stack_fffffffffffffab0;
  string local_520 [4];
  char *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  MockSpec<void_(int,_double,_double)> *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffc54;
  NiceMock<MockNLHandler> *in_stack_fffffffffffffc58;
  CStringRef in_stack_fffffffffffffc60;
  NLStringRef in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffce7;
  NLHeader *in_stack_fffffffffffffce8;
  
  testing::NiceMock<MockNLHandler>::NiceMock(in_stack_fffffffffffffa80);
  testing::InSequence::InSequence(in_stack_fffffffffffffa90);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffa68);
  this_00 = (MockNLHandler *)
            MockNLHandler::gmock_OnHeader
                      (in_stack_fffffffffffffa70,
                       (Matcher<const_mp::NLHeader_&> *)in_stack_fffffffffffffa68);
  testing::internal::MockSpec<void_(const_mp::NLHeader_&)>::InternalExpectedAt
            ((MockSpec<void_(const_mp::NLHeader_&)> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60);
  testing::Matcher<const_mp::NLHeader_&>::~Matcher((Matcher<const_mp::NLHeader_&> *)0x170620);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
  testing::Matcher<double>::Matcher(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testing::Matcher<double>::Matcher(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  __lhs = MockNLHandler::gmock_OnVarBounds
                    (this_00,in_stack_fffffffffffffa78,(Matcher<double> *)in_stack_fffffffffffffa70,
                     (Matcher<double> *)in_stack_fffffffffffffa68);
  testing::internal::MockSpec<void_(int,_double,_double)>::InternalExpectedAt
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
             in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x1706be);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x1706cb);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x1706d8);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffa68);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffa68);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffa68);
  this_01 = (NLHeader *)
            MockNLHandler::gmock_OnObj
                      (this_00,(Matcher<int> *)__lhs,
                       (Matcher<mp::obj::Type> *)in_stack_fffffffffffffa70,
                       (Matcher<BasicTestExpr<0>_> *)in_stack_fffffffffffffa68);
  testing::internal::MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::InternalExpectedAt
            ((MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60);
  testing::Matcher<BasicTestExpr<0>_>::~Matcher((Matcher<BasicTestExpr<0>_> *)0x170779);
  testing::Matcher<mp::obj::Type>::~Matcher((Matcher<mp::obj::Type> *)0x170786);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x170793);
  s = local_520;
  memset(s,0,0x110);
  mp::NLHeader::NLHeader(this_01);
  local_520[0]._M_string_length._0_4_ = 1;
  local_520[0]._M_dataplus = (_Alloc_hider)0x1;
  local_520[0]._1_3_ = 0;
  FormatHeader_abi_cxx11_(in_stack_fffffffffffffce8,(bool)in_stack_fffffffffffffce7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this_01);
  mp::NLStringRef::NLStringRef((NLStringRef *)this_01,s);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_578,"");
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc58,in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc54);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffab0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa90);
  testing::InSequence::~InSequence((InSequence *)this_00);
  testing::NiceMock<MockNLHandler>::~NiceMock((NiceMock<MockNLHandler> *)this_01);
  return;
}

Assistant:

TEST(NLReaderTest, ReadBoundsFirst) {
  testing::NiceMock<MockNLHandler> handler;
  testing::InSequence dummy;
  EXPECT_CALL(handler, OnHeader(_));
  EXPECT_CALL(handler, OnVarBounds(0, 1, 2));
  EXPECT_CALL(handler, OnObj(_, _, _));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header, false) + "O0 0\no2\nv0\nv0\nb\n0 1 2\n",
               handler, "", mp::READ_BOUNDS_FIRST);
}